

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateMessageFile
               (FileDescriptor *file,Descriptor *message,bool is_descriptor,
               GeneratorContext *generator_context)

{
  long lVar1;
  ZeroCopyOutputStream *pZVar2;
  GeneratorContext *generator_context_00;
  int iVar3;
  undefined4 extraout_var;
  char *text;
  long lVar4;
  long lVar5;
  string metadata_filename;
  string fullname;
  Printer printer;
  string metadata_fullname;
  string filename;
  string local_168;
  ZeroCopyOutputStream *local_148;
  string local_140;
  GeneratorContext *local_120;
  string local_118;
  Printer local_f8;
  string local_70;
  string local_50;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x6b) == '\0') {
    GeneratedMessageFileName_abi_cxx11_
              (&local_50,(php *)message,(Descriptor *)(ulong)is_descriptor,
               SUB81(generator_context,0));
    iVar3 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_50);
    local_148 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
    io::Printer::Printer(&local_f8,local_148,'^');
    io::Printer::Print(&local_f8,
                       "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
                       ,"filename",*(string **)file);
    FilenameToClassname(&local_140,&local_50);
    iVar3 = std::__cxx11::string::find_last_of((char *)&local_140,0x354046,0xffffffffffffffff);
    if (*(long *)(*(long *)(file + 8) + 8) != 0) {
      std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_140);
      io::Printer::Print(&local_f8,"namespace ^name^;\n\n","name",&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
    }
    text = 
    "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
    ;
    if (is_descriptor) {
      text = 
      "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\GPBWire;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\InputStream;\n\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
      ;
    }
    io::Printer::Print(&local_f8,text);
    GenerateMessageDocComment(&local_f8,message);
    if (iVar3 == -1) {
      io::Printer::Print(&local_f8,"class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n{\n"
                         ,"name",&local_140);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_140);
      io::Printer::Print(&local_f8,"class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n{\n"
                         ,"name",&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
    }
    io::Printer::Indent(&local_f8);
    io::Printer::Indent(&local_f8);
    local_120 = generator_context;
    if (0 < *(int *)(message + 0x2c)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        GenerateField((FieldDescriptor *)(*(long *)(message + 0x30) + lVar5),&local_f8,is_descriptor
                     );
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0xa8;
      } while (lVar4 < *(int *)(message + 0x2c));
    }
    if (0 < *(int *)(message + 0x38)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        io::Printer::Print(&local_f8,"protected $^name^;\n","name",
                           *(string **)(*(long *)(message + 0x40) + lVar5));
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x30;
      } while (lVar4 < *(int *)(message + 0x38));
    }
    io::Printer::Print(&local_f8,"\n");
    io::Printer::Print(&local_f8,"public function __construct() {\n");
    io::Printer::Indent(&local_f8);
    io::Printer::Indent(&local_f8);
    GeneratedMetadataFileName(&local_168,*(string **)file,is_descriptor);
    FilenameToClassname(&local_70,&local_168);
    io::Printer::Print(&local_f8,"\\^fullname^::initOnce();\nparent::__construct();\n","fullname",
                       &local_70);
    io::Printer::Outdent(&local_f8);
    io::Printer::Outdent(&local_f8);
    io::Printer::Print(&local_f8,"}\n\n");
    if (0 < *(int *)(message + 0x2c)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        GenerateFieldAccessor
                  ((FieldDescriptor *)(*(long *)(message + 0x30) + lVar5),is_descriptor,&local_f8);
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0xa8;
      } while (lVar4 < *(int *)(message + 0x2c));
    }
    if (0 < *(int *)(message + 0x38)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        lVar1 = *(long *)(message + 0x40);
        UnderscoresToCamelCase(&local_118,*(string **)(lVar1 + lVar5),true);
        io::Printer::Print(&local_f8,
                           "public function get^camel_name^()\n{\n    return $this->whichOneof(\"^name^\");\n}\n\n"
                           ,"camel_name",&local_118,"name",*(string **)(lVar1 + lVar5));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x30;
      } while (lVar4 < *(int *)(message + 0x38));
    }
    io::Printer::Outdent(&local_f8);
    io::Printer::Outdent(&local_f8);
    io::Printer::Print(&local_f8,"}\n\n");
    generator_context_00 = local_120;
    if (0 < *(int *)(message + 0x48)) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        GenerateMessageFile(file,(Descriptor *)(*(long *)(message + 0x50) + lVar4),is_descriptor,
                            generator_context_00);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0xa8;
      } while (lVar5 < *(int *)(message + 0x48));
    }
    if (0 < *(int *)(message + 0x58)) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        GenerateEnumFile(file,(EnumDescriptor *)(*(long *)(message + 0x60) + lVar4),is_descriptor,
                         generator_context_00);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x38;
      } while (lVar5 < *(int *)(message + 0x58));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pZVar2 = local_148;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    io::Printer::~Printer(&local_f8);
    if (pZVar2 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar2->_vptr_ZeroCopyOutputStream[1])(pZVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         bool is_descriptor,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedMessageFileName(message, is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->package().empty()) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(is_descriptor, &printer);

  GenerateMessageDocComment(&printer, message);
  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^ extends \\Google\\Protobuf\\Internal\\Message\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, is_descriptor);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  printer.Print(
      "public function __construct() {\n");
  Indent(&printer);

  std::string metadata_filename =
      GeneratedMetadataFileName(file->name(), is_descriptor);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n"
      "parent::__construct();\n",
      "fullname", metadata_fullname);

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, is_descriptor, &printer);
  }
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), is_descriptor,
                     generator_context);
  }
}